

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::SetCurrentChannel(ImDrawListSplitter *this,ImDrawList *draw_list,int idx)

{
  int iVar1;
  undefined8 *puVar2;
  long lVar3;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  ImDrawCmd *curr_cmd;
  undefined4 in_stack_00000010;
  
  if ((in_EDX < 0) || (in_RDI[1] <= in_EDX)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_draw.cpp"
                ,0x60b,"SetCurrentChannel","ImGui ASSERT FAILED: %s","idx >= 0 && idx < _Count");
  }
  if (*in_RDI != in_EDX) {
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 4) + (long)*in_RDI * 0x20);
    *puVar2 = *(undefined8 *)in_RSI;
    puVar2[1] = *(undefined8 *)(in_RSI + 2);
    lVar3 = *(long *)(in_RDI + 4) + (long)*in_RDI * 0x20;
    *(undefined8 *)(lVar3 + 0x10) = *(undefined8 *)(in_RSI + 4);
    *(undefined8 *)(lVar3 + 0x18) = *(undefined8 *)(in_RSI + 6);
    *in_RDI = in_EDX;
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 4) + (long)in_EDX * 0x20);
    *(undefined8 *)in_RSI = *puVar2;
    *(undefined8 *)(in_RSI + 2) = puVar2[1];
    lVar3 = *(long *)(in_RDI + 4) + (long)in_EDX * 0x20;
    *(undefined8 *)(in_RSI + 4) = *(undefined8 *)(lVar3 + 0x10);
    *(undefined8 *)(in_RSI + 6) = *(undefined8 *)(lVar3 + 0x18);
    *(long *)(in_RSI + 0x16) = *(long *)(in_RSI + 6) + (long)in_RSI[4] * 2;
    puVar2 = (undefined8 *)(*(long *)(in_RSI + 2) + (long)(*in_RSI + -1) * 0x38);
    if (*(int *)(puVar2 + 4) == 0) {
      *puVar2 = *(undefined8 *)(in_RSI + 0x24);
      puVar2[1] = *(undefined8 *)(in_RSI + 0x26);
      puVar2[2] = *(undefined8 *)(in_RSI + 0x28);
      *(int *)(puVar2 + 3) = in_RSI[0x2a];
    }
    else {
      iVar1 = memcmp(puVar2,in_RSI + 0x24,0x1c);
      if (iVar1 != 0) {
        ImDrawList::AddDrawCmd((ImDrawList *)CONCAT44(idx,in_stack_00000010));
      }
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::SetCurrentChannel(ImDrawList* draw_list, int idx)
{
    IM_ASSERT(idx >= 0 && idx < _Count);
    if (_Current == idx)
        return;

    // Overwrite ImVector (12/16 bytes), four times. This is merely a silly optimization instead of doing .swap()
    memcpy(&_Channels.Data[_Current]._CmdBuffer, &draw_list->CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&_Channels.Data[_Current]._IdxBuffer, &draw_list->IdxBuffer, sizeof(draw_list->IdxBuffer));
    _Current = idx;
    memcpy(&draw_list->CmdBuffer, &_Channels.Data[idx]._CmdBuffer, sizeof(draw_list->CmdBuffer));
    memcpy(&draw_list->IdxBuffer, &_Channels.Data[idx]._IdxBuffer, sizeof(draw_list->IdxBuffer));
    draw_list->_IdxWritePtr = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size;

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();
}